

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ImplementationArrayTestCase::test
          (ImplementationArrayTestCase *this)

{
  CallLogWrapper *this_00;
  GLint targetArrayLength;
  vector<int,_std::allocator<int>_> queryResult;
  value_type_conflict1 local_40;
  GLint local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  (*this->m_verifier->_vptr_StateVerifier[5])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetLengthTargetName,(ulong)(uint)this->m_minValue);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_3c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,this->m_testTargetLengthTargetName,&local_3c);
  ApiCase::expectError(&this->super_ApiCase,0);
  if ((long)local_3c != 0) {
    local_38._M_impl.super__Vector_impl_data._M_start = (GLint *)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = 0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&local_38,(long)local_3c,&local_40);
    glu::CallLogWrapper::glGetIntegerv
              (this_00,this->m_testTargetName,local_38._M_impl.super__Vector_impl_data._M_start);
    ApiCase::expectError(&this->super_ApiCase,0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, m_testTargetLengthTargetName, m_minValue);
		expectError(GL_NO_ERROR);

		GLint targetArrayLength = 0;
		glGetIntegerv(m_testTargetLengthTargetName, &targetArrayLength);
		expectError(GL_NO_ERROR);

		if (targetArrayLength)
		{
			std::vector<GLint> queryResult;
			queryResult.resize(targetArrayLength, 0);

			glGetIntegerv(m_testTargetName, &queryResult[0]);
			expectError(GL_NO_ERROR);
		}
	}